

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

bool __thiscall
cfd::TransactionContext::IsFindUtxoMap(TransactionContext *this,OutPoint *outpoint,UtxoData *utxo)

{
  pointer *object;
  pointer pUVar1;
  bool bVar2;
  uint32_t uVar3;
  Txid *this_00;
  Txid local_50;
  
  pUVar1 = (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = &((this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
              _M_impl.super__Vector_impl_data._M_start)->txid;
  do {
    object = &this_00[-2].data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if ((pointer)object == pUVar1) {
LAB_003243ca:
      return (pointer)object != pUVar1;
    }
    uVar3 = core::OutPoint::GetVout(outpoint);
    if (uVar3 == *(uint32_t *)&this_00[1]._vptr_Txid) {
      core::OutPoint::GetTxid(&local_50,outpoint);
      bVar2 = core::Txid::Equals(this_00,&local_50);
      core::Txid::~Txid(&local_50);
      if (bVar2) {
        if (utxo != (UtxoData *)0x0) {
          UtxoData::operator=(utxo,(UtxoData *)object);
        }
        goto LAB_003243ca;
      }
    }
    this_00 = (Txid *)&this_00[0x27].data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

bool TransactionContext::IsFindUtxoMap(
    const OutPoint& outpoint, UtxoData* utxo) const {
  for (const auto& utxo_data : utxo_map_) {
    if ((outpoint.GetVout() == utxo_data.vout) &&
        utxo_data.txid.Equals(outpoint.GetTxid())) {
      if (utxo != nullptr) *utxo = utxo_data;
      return true;
    }
  }
  return false;
}